

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::IsPrimitiveType(FieldDescriptor *field)

{
  ObjectiveCType OVar1;
  FieldDescriptor *local_18;
  _func_void_FieldDescriptor_ptr *local_10;
  
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_10 = FieldDescriptor::TypeOnceInit;
    local_18 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_10,&local_18);
  }
  OVar1 = GetObjectiveCType((uint)(byte)field[2]);
  return (0x27fU >> (OVar1 & 0x1f) & 1) != 0;
}

Assistant:

bool IsPrimitiveType(const FieldDescriptor* field) {
  ObjectiveCType type = GetObjectiveCType(field);
  switch (type) {
    case OBJECTIVECTYPE_INT32:
    case OBJECTIVECTYPE_UINT32:
    case OBJECTIVECTYPE_INT64:
    case OBJECTIVECTYPE_UINT64:
    case OBJECTIVECTYPE_FLOAT:
    case OBJECTIVECTYPE_DOUBLE:
    case OBJECTIVECTYPE_BOOLEAN:
    case OBJECTIVECTYPE_ENUM:
      return true;
      break;
    default:
      return false;
  }
}